

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  bool bVar1;
  float x;
  float fVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float y;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float n2;
  float fVar9;
  float z;
  float fVar10;
  Point2f local_18;
  
  *pdfPos = 0.0;
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar9 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar7 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar5 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar2 = auVar8._0_4_;
  fVar6 = auVar7._0_4_;
  fVar10 = auVar5._0_4_;
  auVar7 = ZEXT416((uint)(fVar2 * fVar2 + fVar6 * fVar6 + fVar10 * fVar10));
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  fVar9 = auVar7._0_4_;
  auVar7._0_4_ = fVar10 / fVar9;
  auVar7._4_12_ = auVar5._4_12_;
  if (this->hither <= auVar7._0_4_) {
    fVar6 = fVar6 / fVar9;
    auVar4._0_4_ = fVar2 / fVar9;
    auVar4._4_12_ = auVar8._4_12_;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->screenFromLight).m.m[0][1])),auVar4,
                             ZEXT416((uint)(this->screenFromLight).m.m[0][0]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar7,ZEXT416((uint)(this->screenFromLight).m.m[0][2]));
    fVar2 = auVar5._0_4_ + (this->screenFromLight).m.m[0][3];
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->screenFromLight).m.m[3][1])),auVar4,
                             ZEXT416((uint)(this->screenFromLight).m.m[3][0]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar7,ZEXT416((uint)(this->screenFromLight).m.m[3][2]));
    fVar9 = auVar5._0_4_ + (this->screenFromLight).m.m[3][3];
    bVar1 = fVar9 == 1.0;
    local_18.super_Tuple2<pbrt::Point2,_float>.x =
         (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar9));
    if (((this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.x <=
         local_18.super_Tuple2<pbrt::Point2,_float>.x) &&
       (local_18.super_Tuple2<pbrt::Point2,_float>.x <=
        (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x)) {
      auVar5 = vfmadd132ss_fma(auVar4,ZEXT416((uint)(fVar6 * (this->screenFromLight).m.m[1][1])),
                               ZEXT416((uint)(this->screenFromLight).m.m[1][0]));
      auVar5 = vfmadd231ss_fma(auVar5,auVar7,ZEXT416((uint)(this->screenFromLight).m.m[1][2]));
      fVar2 = auVar5._0_4_ + (this->screenFromLight).m.m[1][3];
      local_18.super_Tuple2<pbrt::Point2,_float>.y =
           (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar9));
      if (((this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.y <=
           local_18.super_Tuple2<pbrt::Point2,_float>.y) &&
         (local_18.super_Tuple2<pbrt::Point2,_float>.y <=
          (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y)) {
        FVar3 = PiecewiseConstant2D::PDF(&this->distrib,&local_18);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>;
        auVar4 = vsubps_avx(auVar8,auVar5);
        auVar5 = vmovshdup_avx(auVar4);
        *pdfDir = (FVar3 * auVar4._0_4_ * auVar5._0_4_) /
                  (auVar7._0_4_ * auVar7._0_4_ * auVar7._0_4_ * this->A);
        return;
      }
    }
  }
  *pdfDir = 0.0;
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;
    // Transform ray direction to light space and reject invalid ones
    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }

    // Compute screen space coordinates for direction and test against bounds
    Point3f ps = screenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }

    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() /
              (A * Pow<3>(CosTheta(w)));
}